

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O0

void __thiscall TaprootUtil_Bip86_1_Test::TestBody(TaprootUtil_Bip86_1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_200;
  Message local_1f8;
  string local_1f0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_2;
  Message local_1b8;
  string local_1b0;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_1;
  Message local_178;
  string local_170;
  undefined1 local_150 [8];
  AssertionResult gtest_ar;
  ByteData ctrl;
  Script locking_script;
  SchnorrPubkey output_key;
  TapBranch branch;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  SchnorrPubkey pk;
  TaprootUtil_Bip86_1_Test *this_local;
  
  pk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
             &local_49);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::TapBranch::TapBranch
            ((TapBranch *)
             &output_key.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script
            ((Script *)
             &ctrl.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootUtil::CreateTapScriptControl
            ((ByteData *)&gtest_ar.message_,(SchnorrPubkey *)local_28,
             (TapBranch *)
             &output_key.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Script *)
             &ctrl.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_
            (&local_170,
             (SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_150,
             "\"a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb\"",
             "output_key.GetHex()",(char (*) [65])0x6d6583,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x137,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  cfd::core::Script::GetHex_abi_cxx11_
            (&local_1b0,
             (Script *)
             &ctrl.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_190,
             "\"5120a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb\"",
             "locking_script.GetHex()",
             (char (*) [69])"5120a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb",
             &local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x139,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1f0,(ByteData *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[67],std::__cxx11::string>
            ((EqHelper<false> *)local_1d0,
             "\"c083dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145\"",
             "ctrl.GetHex()",
             (char (*) [67])"c083dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
             &local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x13b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  cfd::core::Script::~Script
            ((Script *)
             &ctrl.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TapBranch::~TapBranch
            ((TapBranch *)
             &output_key.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_28);
  return;
}

Assistant:

TEST(TaprootUtil, Bip86_1) {
  // https://github.com/bitcoin/bips/blob/master/bip-0086.mediawiki
  // Account 0, second receiving address = m/86'/0'/0'/0/1
  // xprv         = xprvA449goEeU9okyiF1LmKiDaTgeXvmh87DVyRd35VPbsSop8n8uALpbtrUhUXByPFKK7C2yuqrB1FrhiDkEMC4RGmA5KTwsE1aB5jRu9zHsuQ
  // xpub         = xpub6H3W6JmYJXN4CCKUSnriaiQRCZmG6aq4sCMDqTu1ACyngw7HShf59hAxYjXgKDuuHThVEUzdHrc3aXCr9kfvQvZPit5dnD3K9xVRBzjK3rX
  // internal_key = 83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145
  // output_key   = a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb
  // scriptPubKey = 5120a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb
  // address      = bc1p4qhjn9zdvkux4e44uhx8tc55attvtyu358kutcqkudyccelu0was9fqzwh
  SchnorrPubkey pk("83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145");
  TapBranch branch;

  SchnorrPubkey output_key;
  Script locking_script;
  auto ctrl = TaprootUtil::CreateTapScriptControl(
    pk, branch, &output_key, &locking_script);
  EXPECT_EQ("a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb",
      output_key.GetHex());
  EXPECT_EQ("5120a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb",
      locking_script.GetHex());
  EXPECT_EQ("c083dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
      ctrl.GetHex());
}